

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O2

map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
* deqp::egl::SurfaceConfig::getDefaultRules(void)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
  *in_RDI;
  key_type local_14;
  
  p_Var1 = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3020;
  pmVar2->value = 0;
  pmVar2->criteria = CRITERIA_AT_LEAST;
  pmVar2->sortOrder = SORTORDER_SMALLER;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3024;
  pmVar2->value = 0;
  pmVar2->criteria = CRITERIA_AT_LEAST;
  pmVar2->sortOrder = SORTORDER_SPECIAL;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3023;
  pmVar2->value = 0;
  pmVar2->criteria = CRITERIA_AT_LEAST;
  pmVar2->sortOrder = SORTORDER_SPECIAL;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3022;
  pmVar2->value = 0;
  pmVar2->criteria = CRITERIA_AT_LEAST;
  pmVar2->sortOrder = SORTORDER_SPECIAL;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x303d;
  pmVar2->value = 0;
  pmVar2->criteria = CRITERIA_AT_LEAST;
  pmVar2->sortOrder = SORTORDER_SPECIAL;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3021;
  pmVar2->value = 0;
  pmVar2->criteria = CRITERIA_AT_LEAST;
  pmVar2->sortOrder = SORTORDER_SPECIAL;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x303e;
  pmVar2->value = 0;
  pmVar2->criteria = CRITERIA_AT_LEAST;
  pmVar2->sortOrder = SORTORDER_SMALLER;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3039;
  pmVar2->value = -1;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x303a;
  pmVar2->value = -1;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x303f;
  pmVar2->value = 0x308e;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3027;
  pmVar2->value = -1;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_SPECIAL;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3028;
  pmVar2->value = -1;
  *(undefined1 **)&pmVar2->criteria = &DAT_100000001;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3042;
  pmVar2->value = 0;
  pmVar2->criteria = CRITERIA_MASK;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3025;
  pmVar2->value = 0;
  pmVar2->criteria = CRITERIA_AT_LEAST;
  pmVar2->sortOrder = SORTORDER_SMALLER;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3029;
  pmVar2->value = 0;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x303c;
  pmVar2->value = -1;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x303b;
  pmVar2->value = -1;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x302d;
  pmVar2->value = -1;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x302f;
  pmVar2->value = -1;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_SPECIAL;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3040;
  pmVar2->value = 1;
  pmVar2->criteria = CRITERIA_MASK;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3032;
  pmVar2->value = 0;
  pmVar2->criteria = CRITERIA_AT_LEAST;
  pmVar2->sortOrder = SORTORDER_SMALLER;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3031;
  pmVar2->value = 0;
  pmVar2->criteria = CRITERIA_AT_LEAST;
  pmVar2->sortOrder = SORTORDER_SMALLER;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3026;
  pmVar2->value = 0;
  pmVar2->criteria = CRITERIA_AT_LEAST;
  pmVar2->sortOrder = SORTORDER_SMALLER;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3033;
  pmVar2->value = 4;
  pmVar2->criteria = CRITERIA_MASK;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3034;
  pmVar2->value = 0x3038;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3037;
  pmVar2->value = -1;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3036;
  pmVar2->value = -1;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3035;
  pmVar2->value = -1;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3301;
  pmVar2->value = -1;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_SPECIAL;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3311;
  pmVar2->value = -1;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3312;
  pmVar2->value = -1;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3317;
  pmVar2->value = -1;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x330a;
  pmVar2->value = -1;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_NONE;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x331a;
  pmVar2->value = -1;
  pmVar2->criteria = CRITERIA_AT_LEAST;
  pmVar2->sortOrder = SORTORDER_SPECIAL;
  pmVar2 = std::
           map<unsigned_int,_deqp::egl::AttribRule,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
           ::operator[](in_RDI,&local_14);
  pmVar2->name = 0x3339;
  pmVar2->value = 0x333a;
  pmVar2->criteria = CRITERIA_EXACT;
  pmVar2->sortOrder = SORTORDER_SPECIAL;
  return in_RDI;
}

Assistant:

static std::map<EGLenum, AttribRule> getDefaultRules (void)
	{
		// \todo [2011-03-24 pyry] From EGL 1.4 spec - check that this is valid for other versions as well
		std::map<EGLenum, AttribRule> rules;

		//									Attribute									Default				Selection Criteria	Sort Order			Sort Priority
		rules[EGL_BUFFER_SIZE]				= AttribRule(EGL_BUFFER_SIZE,				0,					CRITERIA_AT_LEAST,	SORTORDER_SMALLER);	//	4
		rules[EGL_RED_SIZE]					= AttribRule(EGL_RED_SIZE,					0,					CRITERIA_AT_LEAST,	SORTORDER_SPECIAL);	//	3
		rules[EGL_GREEN_SIZE]				= AttribRule(EGL_GREEN_SIZE,				0,					CRITERIA_AT_LEAST,	SORTORDER_SPECIAL);	//	3
		rules[EGL_BLUE_SIZE]				= AttribRule(EGL_BLUE_SIZE,					0,					CRITERIA_AT_LEAST,	SORTORDER_SPECIAL);	//	3
		rules[EGL_LUMINANCE_SIZE]			= AttribRule(EGL_LUMINANCE_SIZE,			0,					CRITERIA_AT_LEAST,	SORTORDER_SPECIAL);	//	3
		rules[EGL_ALPHA_SIZE]				= AttribRule(EGL_ALPHA_SIZE,				0,					CRITERIA_AT_LEAST,	SORTORDER_SPECIAL);	//	3
		rules[EGL_ALPHA_MASK_SIZE]			= AttribRule(EGL_ALPHA_MASK_SIZE,			0,					CRITERIA_AT_LEAST,	SORTORDER_SMALLER);	//	9
		rules[EGL_BIND_TO_TEXTURE_RGB]		= AttribRule(EGL_BIND_TO_TEXTURE_RGB,		EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_BIND_TO_TEXTURE_RGBA]		= AttribRule(EGL_BIND_TO_TEXTURE_RGBA,		EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_COLOR_BUFFER_TYPE]		= AttribRule(EGL_COLOR_BUFFER_TYPE,			EGL_RGB_BUFFER,		CRITERIA_EXACT,		SORTORDER_NONE);	//	2
		rules[EGL_CONFIG_CAVEAT]			= AttribRule(EGL_CONFIG_CAVEAT,				EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_SPECIAL);	//	1
		rules[EGL_CONFIG_ID]				= AttribRule(EGL_CONFIG_ID,					EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_SMALLER);	//	11
		rules[EGL_CONFORMANT]				= AttribRule(EGL_CONFORMANT,				0,					CRITERIA_MASK,		SORTORDER_NONE);
		rules[EGL_DEPTH_SIZE]				= AttribRule(EGL_DEPTH_SIZE,				0,					CRITERIA_AT_LEAST,	SORTORDER_SMALLER);	//	7
		rules[EGL_LEVEL]					= AttribRule(EGL_LEVEL,						0,					CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_MAX_SWAP_INTERVAL]		= AttribRule(EGL_MAX_SWAP_INTERVAL,			EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_MIN_SWAP_INTERVAL]		= AttribRule(EGL_MIN_SWAP_INTERVAL,			EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_NATIVE_RENDERABLE]		= AttribRule(EGL_NATIVE_RENDERABLE,			EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_NATIVE_VISUAL_TYPE]		= AttribRule(EGL_NATIVE_VISUAL_TYPE,		EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_SPECIAL);	//	10
		rules[EGL_RENDERABLE_TYPE]			= AttribRule(EGL_RENDERABLE_TYPE,			EGL_OPENGL_ES_BIT,	CRITERIA_MASK,		SORTORDER_NONE);
		rules[EGL_SAMPLE_BUFFERS]			= AttribRule(EGL_SAMPLE_BUFFERS,			0,					CRITERIA_AT_LEAST,	SORTORDER_SMALLER);	//	5
		rules[EGL_SAMPLES]					= AttribRule(EGL_SAMPLES,					0,					CRITERIA_AT_LEAST,	SORTORDER_SMALLER);	//	6
		rules[EGL_STENCIL_SIZE]				= AttribRule(EGL_STENCIL_SIZE,				0,					CRITERIA_AT_LEAST,	SORTORDER_SMALLER);	//	8
		rules[EGL_SURFACE_TYPE]				= AttribRule(EGL_SURFACE_TYPE,				EGL_WINDOW_BIT,		CRITERIA_MASK,		SORTORDER_NONE);
		rules[EGL_TRANSPARENT_TYPE]			= AttribRule(EGL_TRANSPARENT_TYPE,			EGL_NONE,			CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_TRANSPARENT_RED_VALUE]	= AttribRule(EGL_TRANSPARENT_RED_VALUE,		EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_TRANSPARENT_GREEN_VALUE]	= AttribRule(EGL_TRANSPARENT_GREEN_VALUE,	EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_TRANSPARENT_BLUE_VALUE]	= AttribRule(EGL_TRANSPARENT_BLUE_VALUE,	EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);

		// EGL_EXT_yuv_surface
		rules[EGL_YUV_ORDER_EXT]			= AttribRule(EGL_YUV_ORDER_EXT,				EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_SPECIAL);
		rules[EGL_YUV_NUMBER_OF_PLANES_EXT]	= AttribRule(EGL_YUV_NUMBER_OF_PLANES_EXT,	EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_YUV_SUBSAMPLE_EXT]		= AttribRule(EGL_YUV_SUBSAMPLE_EXT,			EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_YUV_DEPTH_RANGE_EXT]		= AttribRule(EGL_YUV_DEPTH_RANGE_EXT,		EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_YUV_CSC_STANDARD_EXT]		= AttribRule(EGL_YUV_CSC_STANDARD_EXT,		EGL_DONT_CARE,		CRITERIA_EXACT,		SORTORDER_NONE);
		rules[EGL_YUV_PLANE_BPP_EXT]		= AttribRule(EGL_YUV_PLANE_BPP_EXT,			EGL_DONT_CARE,		CRITERIA_AT_LEAST,	SORTORDER_SPECIAL);	//	3

		// EGL_EXT_pixel_format_float
		rules[EGL_COLOR_COMPONENT_TYPE_EXT]	= AttribRule(EGL_COLOR_COMPONENT_TYPE_EXT,	EGL_COLOR_COMPONENT_TYPE_FIXED_EXT,		CRITERIA_EXACT,		SORTORDER_SPECIAL);	//	2

		return rules;
	}